

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O1

void * Ver_FormulaParser(char *pFormula,void *pMan,Vec_Ptr_t *vNames,Vec_Ptr_t *vStackFn,
                        Vec_Int_t *vStackOp,char *pErrorMessage)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Hop_Obj_t *pHVar5;
  void **ppvVar6;
  void *pvVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  char *pcVar11;
  bool bVar12;
  int local_54;
  
  vNames->nSize = 0;
  vStackFn->nSize = 0;
  vStackOp->nSize = 0;
  iVar3 = strcmp(pFormula,"0");
  if ((iVar3 == 0) || (iVar3 = strcmp(pFormula,"1\'b0"), iVar3 == 0)) {
    pvVar7 = (void *)(*(ulong *)((long)pMan + 0x18) ^ 1);
  }
  else {
    iVar3 = strcmp(pFormula,"1");
    if ((iVar3 != 0) && (iVar3 = strcmp(pFormula,"1\'b1"), iVar3 != 0)) {
      iVar3 = 0;
      pcVar11 = pFormula;
      do {
        cVar2 = *pcVar11;
        if (cVar2 == '(') {
          iVar3 = iVar3 + 1;
        }
        else if (cVar2 == ')') {
          iVar3 = iVar3 + -1;
        }
        else if (cVar2 == '\0') goto LAB_00352d66;
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
    pvVar7 = *(void **)((long)pMan + 0x18);
  }
  return pvVar7;
LAB_00352d66:
  if (iVar3 != 0) {
    pcVar11 = "Parse_FormulaParser(): Different number of opening and closing parentheses ().";
    sVar9 = 0x4f;
LAB_00352d76:
    memcpy(pErrorMessage,pcVar11,sVar9);
    return (void *)0x0;
  }
  sVar9 = strlen(pFormula);
  (pFormula + sVar9 + 1)[0] = ')';
  (pFormula + sVar9 + 1)[1] = '\0';
  if (sVar9 != 0) {
    memmove(pFormula + 1,pFormula,sVar9);
  }
  *pFormula = '(';
  local_54 = 1;
  cVar2 = '\x01';
  do {
    bVar1 = *pFormula;
    if (bVar1 < 0x3a) {
      if (0x1f < bVar1) {
        switch(bVar1) {
        case 0x20:
          goto switchD_00352de6_caseD_20;
        case 0x21:
switchD_00352de6_caseD_21:
          if (cVar2 != '\x02') {
            Vec_IntPush(vStackOp,7);
            goto LAB_003530ff;
          }
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before negation.",0x31);
          break;
        default:
          goto switchD_00352de6_caseD_22;
        case 0x26:
          goto switchD_00352de6_caseD_26;
        case 0x28:
          if (cVar2 != '\x02') {
            Vec_IntPush(vStackOp,1);
            local_54 = 1;
            cVar2 = '\x01';
            goto LAB_003530ff;
          }
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before a parenthesis.",0x36
                         );
          break;
        case 0x29:
          if (vStackOp->nSize != 0) {
            while (iVar3 = vStackOp->nSize, iVar3 != 0) {
              if (iVar3 < 1) goto LAB_00353376;
              vStackOp->nSize = iVar3 - 1U;
              if (vStackOp->pArray[iVar3 - 1U] == 1) {
                bVar12 = local_54 == 4;
                local_54 = (uint)bVar12 * 2 + 2;
                cVar2 = bVar12 * '\x02' + '\x02';
                goto LAB_003530ff;
              }
              pHVar5 = Ver_FormulaParserTopOper
                                 ((Hop_Man_t *)pMan,vStackFn,vStackOp->pArray[iVar3 - 1U]);
              if (pHVar5 == (Hop_Obj_t *)0x0) {
                builtin_strncpy(pErrorMessage + 0x10,"ser(): Unknown operation\n",0x1a);
                goto LAB_003532a4;
              }
            }
          }
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): There is no opening parenthesis\n",
                          0x38);
        }
LAB_00352e8e:
        local_54 = 4;
        cVar2 = '\x04';
        goto LAB_003530ff;
      }
      if ((1 < bVar1 - 9) && (bVar1 != 0xd)) {
        if (bVar1 != 0) goto switchD_00352de6_caseD_22;
LAB_003532b0:
        if (cVar2 == '\x04') {
          return (void *)0x0;
        }
        if (vStackFn->nSize == 0) {
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): The input string is empty\n",0x32);
          return (void *)0x0;
        }
        pvVar7 = Vec_PtrPop(vStackFn);
        if (vStackFn->nSize != 0) {
          builtin_strncpy(pErrorMessage + 0x10,"ser(): Something is left in the function stack\n",
                          0x30);
LAB_003532a4:
          builtin_strncpy(pErrorMessage,"Parse_FormulaPar",0x10);
          return (void *)0x0;
        }
        if (vStackOp->nSize == 0) {
          return pvVar7;
        }
        pcVar11 = "Parse_FormulaParser(): Something is left in the operation stack\n";
        sVar9 = 0x41;
        goto LAB_00352d76;
      }
    }
    else {
      if (bVar1 < 0x5e) {
        if ((bVar1 == 0x3a) || (bVar1 == 0x3f)) goto switchD_00352de6_caseD_26;
      }
      else {
        if ((bVar1 == 0x5e) || (bVar1 == 0x7c)) {
switchD_00352de6_caseD_26:
          if (cVar2 != '\x02') {
            memcpy(pErrorMessage,
                   "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR.",0x45);
            goto LAB_00352e8e;
          }
          if (bVar1 < 0x5e) {
            if (bVar1 == 0x26) {
              iVar3 = 6;
              goto LAB_0035305b;
            }
            if (bVar1 == 0x3f) {
              iVar3 = 2;
              goto LAB_0035305b;
            }
          }
          else {
            if (bVar1 == 0x5e) {
              iVar3 = 5;
            }
            else {
              if (bVar1 != 0x7c) goto LAB_00353060;
              iVar3 = 4;
            }
LAB_0035305b:
            Vec_IntPush(vStackOp,iVar3);
          }
LAB_00353060:
          local_54 = 3;
          cVar2 = '\x03';
          goto LAB_003530ff;
        }
        if (bVar1 == 0x7e) goto switchD_00352de6_caseD_21;
      }
switchD_00352de6_caseD_22:
      iVar3 = Ver_FormulaParserFindVar(pFormula,vNames);
      bVar1 = *pFormula;
      if ((iVar3 < 0) || (vNames->nSize <= iVar3 * 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (cVar2 == '\x02') {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Incorrect state.",0x28);
        return (void *)0x0;
      }
      iVar10 = *(int *)(vNames->pArray + (uint)(iVar3 * 2));
      pHVar5 = Hop_IthVar((Hop_Man_t *)pMan,iVar3);
      uVar8 = vStackFn->nCap;
      if (vStackFn->nSize == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (vStackFn->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(vStackFn->pArray,0x80);
          }
          vStackFn->pArray = ppvVar6;
          iVar3 = 0x10;
        }
        else {
          iVar3 = uVar8 * 2;
          if (iVar3 <= (int)uVar8) goto LAB_003530ce;
          if (vStackFn->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(vStackFn->pArray,(ulong)uVar8 << 4);
          }
          vStackFn->pArray = ppvVar6;
        }
        vStackFn->nCap = iVar3;
      }
LAB_003530ce:
      pFormula = (char *)((byte *)pFormula + (long)(iVar10 + -1) + (ulong)(bVar1 == 0x5c));
      iVar3 = vStackFn->nSize;
      vStackFn->nSize = iVar3 + 1;
      vStackFn->pArray[iVar3] = pHVar5;
      local_54 = 2;
      cVar2 = '\x02';
LAB_003530ff:
      if (cVar2 != '\x01') {
        if (cVar2 == '\x02') {
          while (iVar3 = vStackOp->nSize, iVar3 != 0) {
            if (iVar3 < 1) {
LAB_00353376:
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            vStackOp->nSize = iVar3 - 1U;
            iVar10 = vStackOp->pArray[iVar3 - 1U];
            if (iVar10 != 7) goto LAB_00353246;
            if (vStackFn->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
            }
            ppvVar6 = vStackFn->pArray;
            uVar4 = vStackFn->nSize - 1;
            vStackFn->nSize = uVar4;
            pvVar7 = ppvVar6[uVar4];
            uVar8 = vStackFn->nCap;
            if (uVar4 == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,0x80);
                }
                iVar3 = 0x10;
              }
              else {
                iVar3 = uVar8 * 2;
                if (iVar3 <= (int)uVar8) goto LAB_003531f1;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar8 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar8 << 4);
                }
              }
              vStackFn->pArray = ppvVar6;
              vStackFn->nCap = iVar3;
            }
LAB_003531f1:
            iVar3 = vStackFn->nSize;
            vStackFn->nSize = iVar3 + 1;
            vStackFn->pArray[iVar3] = (void *)((ulong)pvVar7 ^ 1);
          }
        }
        else {
          if (cVar2 == '\x04') goto LAB_003532b0;
          while( true ) {
            iVar3 = vStackOp->nSize;
            if (iVar3 < 1) goto LAB_00353376;
            uVar8 = iVar3 - 1;
            vStackOp->nSize = uVar8;
            iVar10 = vStackOp->pArray[uVar8];
            if (uVar8 == 0) goto LAB_00353246;
            vStackOp->nSize = iVar3 - 2U;
            iVar3 = vStackOp->pArray[iVar3 - 2U];
            if ((iVar3 < iVar10) || (iVar3 == 2 && iVar10 == 2)) break;
            pHVar5 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,iVar3);
            if (pHVar5 == (Hop_Obj_t *)0x0) {
              builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Unknown operation\n",0x2a);
              return (void *)0x0;
            }
            Vec_IntPush(vStackOp,iVar10);
          }
          Vec_IntPush(vStackOp,iVar3);
LAB_00353246:
          Vec_IntPush(vStackOp,iVar10);
        }
      }
    }
switchD_00352de6_caseD_20:
    pFormula = (char *)((byte *)pFormula + 1);
  } while( true );
}

Assistant:

void * Ver_FormulaParser( char * pFormula, void * pMan, Vec_Ptr_t * vNames, Vec_Ptr_t * vStackFn, Vec_Int_t * vStackOp, char * pErrorMessage )
{
    char * pTemp;
    Hop_Obj_t * bFunc, * bTemp;
    int nParans, Flag;
    int Oper, Oper1, Oper2;
    int v;

    // clear the stacks and the names
    Vec_PtrClear( vNames );
    Vec_PtrClear( vStackFn );
    Vec_IntClear( vStackOp );

    if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1\'b0") )
        return Hop_ManConst0((Hop_Man_t *)pMan);
    if ( !strcmp(pFormula, "1") || !strcmp(pFormula, "1\'b1") )
        return Hop_ManConst1((Hop_Man_t *)pMan);

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        sprintf( pErrorMessage, "Parse_FormulaParser(): Different number of opening and closing parentheses ()." );
        return NULL;
    }
 
    // add parentheses
    pTemp = pFormula + strlen(pFormula) + 2;
    *pTemp-- = 0; *pTemp = ')';
    while ( --pTemp != pFormula )
        *pTemp = *(pTemp - 1);
    *pTemp = '(';

    // perform parsing
    Flag = VER_PARSE_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
/*
        // treat Constant 0 as a variable
        case VER_PARSE_SYM_CONST0:
            Vec_PtrPush( vStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( Hop_ManConst0(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 0." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;

        // the same for Constant 1
        case VER_PARSE_SYM_CONST1:
            Vec_PtrPush( vStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( Hop_ManConst1(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 1." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;
*/
        case VER_PARSE_SYM_NEGBEF1:
        case VER_PARSE_SYM_NEGBEF2:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before negation." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_NEG );
            break;

        case VER_PARSE_SYM_AND:
        case VER_PARSE_SYM_OR:
        case VER_PARSE_SYM_XOR:
        case VER_PARSE_SYM_MUX1:
        case VER_PARSE_SYM_MUX2:
            if ( Flag != VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == VER_PARSE_SYM_AND )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_AND );
            else if ( *pTemp == VER_PARSE_SYM_OR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_OR );
            else if ( *pTemp == VER_PARSE_SYM_XOR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_XOR );
            else if ( *pTemp == VER_PARSE_SYM_MUX1 )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
//            else if ( *pTemp == VER_PARSE_SYM_MUX2 )
//                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
            Flag = VER_PARSE_FLAG_OPER; 
            break;

        case VER_PARSE_SYM_OPEN:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before a parenthesis." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = VER_PARSE_FLAG_START; 
            break;

        case VER_PARSE_SYM_CLOSE:
            if ( Vec_IntSize( vStackOp ) )
            {
                while ( 1 )
                {
                    if ( !Vec_IntSize( vStackOp ) )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                        Flag = VER_PARSE_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( vStackOp );
                    if ( Oper == VER_PARSE_OPER_MARK )
                        break;
                    // skip the second MUX operation
//                    if ( Oper == VER_PARSE_OPER_MUX2 )
//                    {
//                        Oper = Vec_IntPop( vStackOp );
//                        assert( Oper == VER_PARSE_OPER_MUX1 );
//                    }

                    // perform the given operation
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                }
            }
            else
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( Flag != VER_PARSE_FLAG_ERROR )
                Flag = VER_PARSE_FLAG_VAR; 
            break;


        default:
            // scan the next name
            v = Ver_FormulaParserFindVar( pTemp, vNames );
            if ( *pTemp == '\\' )
                pTemp++;
            pTemp += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v ) - 1;

            // assume operation AND, if vars follow one another
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Incorrect state." );
                return NULL;
            }
            bTemp = Hop_IthVar( (Hop_Man_t *)pMan, v );
            Vec_PtrPush( vStackFn, bTemp ); //  Cudd_Ref( bTemp );
            Flag = VER_PARSE_FLAG_VAR; 
            break;
        }

        if ( Flag == VER_PARSE_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == VER_PARSE_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == VER_PARSE_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( !Vec_IntSize(vStackOp) )
                    break;
                Oper = Vec_IntPop( vStackOp );
                if ( Oper != VER_PARSE_OPER_NEG )
                {
                    Vec_IntPush( vStackOp, Oper );
                    break;
                }
                else
                {
//                      Vec_PtrPush( vStackFn, Cudd_Not(Vec_PtrPop(vStackFn)) );
                      Vec_PtrPush( vStackFn, Hop_Not((Hop_Obj_t *)Vec_PtrPop(vStackFn)) );
                }
            }
        else // if ( Flag == VER_PARSE_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( vStackOp ); // the last operation
                if ( !Vec_IntSize(vStackOp) ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( vStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 && !(Oper1 == Oper2 && Oper1 == VER_PARSE_OPER_MUX) )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper2 ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                    Vec_IntPush( vStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( vStackOp, Oper2 );
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != VER_PARSE_FLAG_ERROR )
    {
        if ( Vec_PtrSize(vStackFn) )
        {    
            bFunc = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
            if ( !Vec_PtrSize(vStackFn) )
                if ( !Vec_IntSize(vStackOp) )
                {
//                    Cudd_Deref( bFunc );
                    return bFunc;
                }
                else
                    sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the operation stack\n" );
            else
                sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the function stack\n" );
        }
        else
            sprintf( pErrorMessage, "Parse_FormulaParser(): The input string is empty\n" );
    }
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bFunc );
    return NULL;
}